

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Parser::extractBracketArguments
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Parser *this,string *data)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  string *this_00;
  ulong uVar5;
  reference pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  uint local_60;
  uint c;
  int local_50;
  byte local_49;
  int bracketDepth;
  bool isQuoteOpen;
  string argumentBuffer;
  string *data_local;
  Parser *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&bracketDepth);
  local_49 = 0;
  local_50 = 0;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)data);
  if (*pcVar2 == '(') {
    std::__cxx11::string::erase((ulong)data,0);
  }
  std::__cxx11::string::size();
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)data);
  if (*pcVar2 == ')') {
    lVar3 = std::__cxx11::string::size();
    std::__cxx11::string::erase((ulong)data,lVar3 - 1);
  }
  local_60 = 0;
  while( true ) {
    uVar5 = (ulong)local_60;
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= uVar5) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &bracketDepth);
      }
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(__return_storage_ptr__);
      arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(__return_storage_ptr__);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&arg), bVar1) {
        pbVar6 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
        while (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pbVar6), *pcVar2 == ' ') {
          std::__cxx11::string::erase((ulong)pbVar6,0);
        }
        while( true ) {
          std::__cxx11::string::size();
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pbVar6);
          if (*pcVar2 != ' ') break;
          lVar3 = std::__cxx11::string::size();
          std::__cxx11::string::erase((ulong)pbVar6,lVar3 - 1);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      std::__cxx11::string::~string((string *)&bracketDepth);
      return __return_storage_ptr__;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)data);
    if (*pcVar2 == '\"') {
      local_49 = (local_49 ^ 0xff) & 1;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)data);
    if ((*pcVar2 == '(') && ((local_49 & 1) == 0)) {
      local_50 = local_50 + 1;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)data);
      if ((*pcVar2 == ')') && ((local_49 & 1) == 0)) {
        local_50 = local_50 + -1;
      }
    }
    if (local_50 < 0) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)data);
    if ((((*pcVar2 == ',') && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) &&
        ((local_49 & 1) == 0)) && (local_50 == 0)) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bracketDepth)
      ;
      std::__cxx11::string::clear();
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)data);
      std::__cxx11::string::operator+=((string *)&bracketDepth,*pcVar2);
    }
    local_60 = local_60 + 1;
  }
  __range1._6_1_ = 1;
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,"Bracket mismatch",(allocator *)((long)&__range1 + 7));
  __range1._6_1_ = 0;
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

std::vector<std::string> Parser::extractBracketArguments(std::string data)
{
    std::vector<std::string> arguments;
    std::string argumentBuffer;
    bool isQuoteOpen = false;
    int bracketDepth = 0;

    //Take off surrounding brackets if any as these aren't needed in the split results
    if(data[0] == '(')
        data.erase(0,1);
    if(data[data.size()-1] == ')')
        data.erase(data.size()-1, 1);

    //Go through each character and split each argument into a separate vector element
    for(unsigned int c = 0; c < data.size(); c++) //Ignore opening and close brackets
    {
        if(data[c] == '"')
            isQuoteOpen = !isQuoteOpen;
        if(data[c] == '(' && !isQuoteOpen)
            bracketDepth++;
        else if(data[c] == ')' && !isQuoteOpen)
            bracketDepth--;
        if(bracketDepth < 0)
            throw std::string("Bracket mismatch");
        if(data[c] == ',' && !argumentBuffer.empty() && !isQuoteOpen && bracketDepth == 0)
        {
            arguments.emplace_back(argumentBuffer);
            argumentBuffer.clear();
        }
        else
        {
            argumentBuffer += data[c];
        }
    }
    if(!argumentBuffer.empty())
        arguments.emplace_back(argumentBuffer);

    //Fix the spacing
    for(auto &arg : arguments)
    {
        while(arg[0] == ' ')
            arg.erase(0,1);
        while(arg[arg.size()-1] == ' ')
            arg.erase(arg.size()-1, 1);
    }

    return arguments;
}